

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void vkt::shaderexecutor::
     ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  int ndx;
  long lVar1;
  
  std::operator<<(os,"(");
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      if (lVar1 == 3) {
        std::operator<<(os,")");
        return;
      }
      std::operator<<(os,", ");
    }
    printIVal<tcu::Vector<float,2>>(fmt,(IVal *)ival,os);
    lVar1 = lVar1 + 1;
    ival = (IVal *)((long)ival + 0x30);
  } while( true );
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}